

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O2

UINT8 device_start_ay8910_mame(AY8910_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT8 UVar1;
  UINT32 UVar2;
  void *in_RAX;
  void *chip;
  DEV_DATA local_18;
  
  local_18.chipInf = in_RAX;
  UVar2 = ay8910_start(&local_18.chipInf,(cfg->_genCfg).clock,cfg->chipType,cfg->chipFlags);
  if ((DEV_DATA *)local_18.chipInf == (DEV_DATA *)0x0) {
    UVar1 = 0xff;
  }
  else {
    *(void **)local_18.chipInf = local_18.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)local_18.chipInf;
    retDevInf->sampleRate = UVar2;
    retDevInf->devDef = &devDef_AY8910_MAME;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

UINT8 device_start_ay8910_mame(const AY8910_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = ay8910_start(&chip, cfg->_genCfg.clock, cfg->chipType, cfg->chipFlags);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_AY8910_MAME);
	return 0x00;
}